

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCGeometryCollider.cpp
# Opt level: O2

int chrono::collision::ChGeometryCollider::ComputeBoxBoxCollisions
              (ChBox *mgeo1,ChMatrix33<double> *R1,Vector *T1,ChBox *mgeo2,ChMatrix33<double> *R2,
              Vector *T2,ChNarrowPhaseCollider *mcollider,bool just_intersection)

{
  double dVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  uint uVar4;
  Vector *p;
  ulong uVar5;
  undefined1 auVar6 [16];
  ChVector<float> local_2d8;
  Vector mnormal;
  ChVector<double> result;
  Vector local_288;
  Vector local_268;
  Vector local_248;
  Vector relPos;
  ChMatrix33<double> relRot;
  ChVector<double> v;
  
  if (just_intersection) {
    v.m_data[1] = (double)R2;
    v.m_data[0] = (double)R1;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
    _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&relRot,
               (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&v);
    v.m_data._0_16_ = vsubpd_avx(*(undefined1 (*) [16])T2->m_data,*(undefined1 (*) [16])T1->m_data);
    v.m_data[2] = T2->m_data[2] - T1->m_data[2];
    mnormal.m_data[0] = (double)R1;
    chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&mnormal,&v);
    local_248.m_data[0] = relPos.m_data[0];
    local_248.m_data[1] = relPos.m_data[1];
    local_248.m_data[2] = relPos.m_data[2];
    local_268.m_data[0] = (mgeo1->Size).m_data[0];
    local_268.m_data[1] = (mgeo1->Size).m_data[1];
    local_268.m_data[2] = (mgeo1->Size).m_data[2];
    local_288.m_data[0] = (mgeo2->Size).m_data[0];
    local_288.m_data[1] = (mgeo2->Size).m_data[1];
    local_288.m_data[2] = (mgeo2->Size).m_data[2];
    bVar3 = CHOBB::OBB_Overlap(&relRot,&local_248,&local_268,&local_288);
    if (bVar3) {
      ChCollisionPair::ChCollisionPair
                ((ChCollisionPair *)&v,(ChGeometry *)mgeo1,(ChGeometry *)mgeo2);
      ChNarrowPhaseCollider::AddCollisionPair(mcollider,(ChCollisionPair *)&v);
      return 1;
    }
  }
  else {
    p = &v;
    mnormal.m_data[2] = 0.0;
    v.m_data._0_16_ = ZEXT816(0);
    v.m_data[2] = 0.0;
    relRot.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0022;
    mnormal.m_data[0] = 0.0;
    mnormal.m_data[1] = 0.0;
    uVar4 = BoxBoxCollisionTest2::BoxBoxContacts
                      (T1,R1,&mgeo1->Size,T2,R2,&mgeo2->Size,(double *)&relRot,p,&mnormal,
                       relPos.m_data);
    for (uVar5 = 0; (~((int)uVar4 >> 0x1f) & uVar4) != uVar5; uVar5 = uVar5 + 1) {
      dVar1 = relPos.m_data[uVar5];
      if (dVar1 < 0.0022) {
        auVar2._8_8_ = mnormal.m_data[1];
        auVar2._0_8_ = mnormal.m_data[0];
        auVar6._0_8_ = dVar1 * mnormal.m_data[0];
        auVar6._8_8_ = dVar1 * mnormal.m_data[1];
        result.m_data._0_16_ = vsubpd_avx(*(undefined1 (*) [16])p->m_data,auVar6);
        result.m_data[2] = p->m_data[2] - dVar1 * mnormal.m_data[2];
        auVar2 = vcvtpd2ps_avx(auVar2);
        local_2d8.m_data._0_8_ = vmovlps_avx(auVar2);
        local_2d8.m_data[2] = (float)mnormal.m_data[2];
        ChCollisionPair::ChCollisionPair
                  ((ChCollisionPair *)&relRot,(ChGeometry *)mgeo1,(ChGeometry *)mgeo2,&result,p,
                   &local_2d8,(float *)0x0);
        ChNarrowPhaseCollider::AddCollisionPair(mcollider,(ChCollisionPair *)&relRot);
      }
      p = p + 1;
    }
  }
  return 0;
}

Assistant:

int ChGeometryCollider::ComputeBoxBoxCollisions(
    geometry::ChBox& mgeo1,            ///< box 1
    ChMatrix33<>* R1,                  ///< absolute rotation of 1st model (with box 1)
    Vector* T1,                        ///< absolute position of 1st model (with box 1)
    geometry::ChBox& mgeo2,            ///< box 2
    ChMatrix33<>* R2,                  ///< absolute rotation of 2nd model (with box 2)
    Vector* T2,                        ///< absolute position of 2nd model (with box 2)
    ChNarrowPhaseCollider& mcollider,  ///< reference to a collider to store contacts into
    bool just_intersection  ///< if true, just report if intersecting (no further calculus on normal, depht, etc.)
) {
    if (just_intersection) {
        ChMatrix33<> relRot = R1->transpose() * (*R2);
        Vector relPos = R1->transpose() * ((*T2) - (*T1));

        if (CHOBB::OBB_Overlap(relRot, relPos, mgeo1.Size, mgeo2.Size)) {
            ChCollisionPair temp = ChCollisionPair(&mgeo1, &mgeo2);
            mcollider.AddCollisionPair(&temp);
            return 1;
        }
    } else {
        double ArrDist[12];  // 8 should be enough
        Vector ArrP[12];     // 8 should be enough
        Vector mnormal;

        int ncontacts = BoxBoxCollisionTest2::BoxBoxContacts(*T1, *R1, mgeo1.Size, *T2, *R2,
                                                             mgeo2.Size, CH_COLL_ENVELOPE, ArrP, mnormal, ArrDist);

        for (int i = 0; i < ncontacts; i++) {
            if (ArrDist[i] < CH_COLL_ENVELOPE) {
                ChCollisionPair temp = ChCollisionPair(&mgeo1, &mgeo2,  // geometries
                                                       Vadd(ArrP[i], Vmul(mnormal, -ArrDist[i])), ArrP[i],
                                                       mnormal);  // normal
                mcollider.AddCollisionPair(&temp);
            }
        }
    }
    return 0;
}